

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syscall.cpp
# Opt level: O0

void Handle(Trace *trace,int64_t sno,Args *args)

{
  int64_t this;
  runtime_error *this_00;
  Process *pPVar1;
  uint64_t fid;
  exception *ex;
  Process *proc;
  string local_d0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Args *local_20;
  Args *args_local;
  int64_t sno_local;
  Trace *trace_local;
  
  if (-1 < sno) {
    local_20 = args;
    args_local = (Args *)sno;
    sno_local = (int64_t)trace;
    if ((0x13f < (ulong)sno) || (kHandlers[sno] == (HandlerFn)0x0)) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_a0,(long)args_local);
      std::operator+(&local_80,"Unknown syscall ",&local_a0);
      std::operator+(&local_60,&local_80," in ");
      this = sno_local;
      pPVar1 = Trace::GetTrace((Trace *)sno_local,(pid_t)local_20->PID);
      fid = Process::GetImage(pPVar1);
      Trace::GetFileName_abi_cxx11_(&local_d0,(Trace *)this,fid);
      std::operator+(&local_40,&local_60,&local_d0);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pPVar1 = Trace::GetTrace(trace,(pid_t)args->PID);
    (*kHandlers[(long)args_local])(pPVar1,local_20);
  }
  return;
}

Assistant:

void Handle(Trace *trace, int64_t sno, const Args &args)
{
  if (sno < 0) {
    return;
  }

  if (sno > sizeof(kHandlers) / sizeof(kHandlers[0]) || !kHandlers[sno]) {
    throw std::runtime_error(
        "Unknown syscall " + std::to_string(sno) + " in " +
        trace->GetFileName(trace->GetTrace(args.PID)->GetImage())
    );
  }

  auto *proc = trace->GetTrace(args.PID);

  try {
    kHandlers[sno](proc, args);
  } catch (std::exception &ex) {
    throw std::runtime_error(
        "Exception while handling syscall " + std::to_string(sno) +
        " in process " + std::to_string(proc->GetUID()) + " (" +
        trace->GetFileName(proc->GetImage()) +
        "): " +
        ex.what()
    );
  }
}